

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

QcList * qc_list_create(int with_rwlock)

{
  undefined8 *puVar1;
  void *__ptr;
  QcList *pQVar2;
  QcRWLock *pQVar3;
  QcList *extraout_RAX;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *extraout_RDX;
  long in_RSI;
  long lVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  
  plVar8 = (long *)0x28;
  pQVar2 = (QcList *)malloc(0x28);
  if (pQVar2 != (QcList *)0x0) {
    pQVar2->cur = (QcListEntry *)0x0;
    *(undefined8 *)&pQVar2->count = 0;
    pQVar2->head = (QcListEntry *)0x0;
    pQVar2->tail = (QcListEntry *)0x0;
    pQVar2->rwlock = (QcRWLock *)0x0;
    if (with_rwlock != 0) {
      pQVar3 = qc_thread_rwlock_create();
      pQVar2->rwlock = pQVar3;
      if (pQVar3 == (QcRWLock *)0x0) {
        free(pQVar2);
        pQVar2 = (QcList *)0x0;
      }
    }
    return pQVar2;
  }
  qc_list_create_cold_1();
  if (plVar8 != (long *)0x0) {
    puVar5 = (undefined8 *)*plVar8;
    while (puVar5 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar5;
      free(puVar5);
      puVar5 = puVar1;
    }
    if ((QcRWLock *)plVar8[4] != (QcRWLock *)0x0) {
      qc_thread_rwlock_destroy((QcRWLock *)plVar8[4]);
    }
    free(plVar8);
    return extraout_RAX;
  }
  qc_list_destroy_cold_1();
  if (plVar8 != (long *)0x0) {
    return (QcList *)(ulong)*(uint *)(plVar8 + 3);
  }
  qc_list_count_cold_1();
  if (plVar8 == (long *)0x0) {
    qc_list_inserthead_cold_3();
    lVar6 = in_RSI;
    plVar9 = plVar8;
LAB_00103f75:
    qc_list_inserthead_cold_2();
  }
  else {
    lVar6 = in_RSI;
    plVar9 = plVar8;
    if (in_RSI == 0) goto LAB_00103f75;
    plVar9 = (long *)0x18;
    plVar4 = (long *)malloc(0x18);
    if (plVar4 != (long *)0x0) {
      *plVar4 = 0;
      plVar4[1] = 0;
      plVar4[2] = in_RSI;
      plVar4[1] = 0;
      lVar6 = *plVar8;
      *plVar4 = lVar6;
      if (lVar6 != 0) {
        *(long **)(lVar6 + 8) = plVar4;
      }
      if (plVar8[1] == 0) {
        plVar8[1] = (long)plVar4;
      }
      *plVar8 = (long)plVar4;
      *(int *)(plVar8 + 3) = (int)plVar8[3] + 1;
      return (QcList *)0x0;
    }
  }
  qc_list_inserthead_cold_1();
  if (plVar9 == (long *)0x0) {
    qc_list_inserttail_cold_3();
    lVar7 = lVar6;
    plVar8 = plVar9;
LAB_00103fdb:
    qc_list_inserttail_cold_2();
  }
  else {
    lVar7 = lVar6;
    plVar8 = plVar9;
    if (lVar6 == 0) goto LAB_00103fdb;
    plVar8 = (long *)0x18;
    puVar5 = (undefined8 *)malloc(0x18);
    if (puVar5 != (undefined8 *)0x0) {
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = lVar6;
      *puVar5 = 0;
      plVar8 = (long *)plVar9[1];
      puVar5[1] = plVar8;
      if (plVar8 == (long *)0x0) {
        plVar8 = plVar9;
      }
      *plVar8 = (long)puVar5;
      plVar9[1] = (long)puVar5;
      *(int *)(plVar9 + 3) = (int)plVar9[3] + 1;
      return (QcList *)0x0;
    }
  }
  qc_list_inserttail_cold_1();
  if (plVar8 == (long *)0x0) {
    qc_list_inserttail2_cold_3();
    plVar9 = plVar8;
  }
  else {
    plVar9 = plVar8;
    if (lVar7 != 0) {
      plVar9 = (long *)0x18;
      puVar5 = (undefined8 *)malloc(0x18);
      if (puVar5 != (undefined8 *)0x0) {
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar5[2] = lVar7;
        *puVar5 = 0;
        plVar9 = (long *)plVar8[1];
        puVar5[1] = plVar9;
        if (plVar9 == (long *)0x0) {
          plVar9 = plVar8;
        }
        *plVar9 = (long)puVar5;
        plVar8[1] = (long)puVar5;
        *(int *)(plVar8 + 3) = (int)plVar8[3] + 1;
        *extraout_RDX = puVar5;
        return (QcList *)0x0;
      }
      goto LAB_0010404c;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_0010404c:
  qc_list_inserttail2_cold_1();
  if (plVar9 != (long *)0x0) {
    plVar8 = (long *)*plVar9;
    if (plVar8 == (long *)0x0) {
      pQVar2 = (QcList *)0x0;
    }
    else {
      if ((long *)plVar9[2] == plVar8) {
        plVar9[2] = *plVar8;
      }
      lVar6 = *plVar8;
      *plVar9 = lVar6;
      if (lVar6 != 0) {
        *(undefined8 *)(lVar6 + 8) = 0;
      }
      plVar4 = plVar9 + 3;
      *(int *)plVar4 = (int)*plVar4 + -1;
      if ((int)*plVar4 == 0) {
        plVar9[1] = 0;
      }
      pQVar2 = (QcList *)plVar8[2];
      free(plVar8);
    }
    return pQVar2;
  }
  qc_list_pophead_cold_1();
  if (plVar9 == (long *)0x0) {
    qc_list_poptail_cold_1();
    plVar9[2] = *plVar9;
    return (QcList *)*plVar9;
  }
  if ((void *)*plVar9 == (void *)0x0) {
    pQVar2 = (QcList *)0x0;
  }
  else {
    __ptr = (void *)plVar9[1];
    if ((void *)plVar9[2] == __ptr) {
      plVar9[2] = 0;
    }
    plVar8 = plVar9;
    if (__ptr != (void *)*plVar9) {
      plVar8 = *(long **)((long)__ptr + 8);
    }
    *plVar8 = 0;
    plVar9[1] = *(long *)((long)__ptr + 8);
    *(int *)(plVar9 + 3) = (int)plVar9[3] + -1;
    pQVar2 = *(QcList **)((long)__ptr + 0x10);
    free(__ptr);
  }
  return pQVar2;
}

Assistant:

QcList *qc_list_create(int with_rwlock)
{       
    QcList *list;

    qc_malloc(list, sizeof(struct __QcList));
    if(NULL == list)
    {
        return NULL;
    }

    list->head = NULL;
    list->tail = NULL;
    list->cur  = NULL;
    list->count = 0;
    list->rwlock = NULL;

    if(with_rwlock)
    {
        list->rwlock = qc_thread_rwlock_create();
        if(NULL == list->rwlock)
        {
            qc_free(list);
            return NULL;
        }
    }

    return list;
}